

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O0

void __thiscall Kernel::Kernel(Kernel *this,int width,int height)

{
  runtime_error *this_00;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<float,_std::allocator<float>_> *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  this_01 = (vector<float,_std::allocator<float>_> *)(in_RDI + 4);
  memset(this_01,0,0x18);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x11c5f5);
  in_RDI[10] = 0x3f800000;
  if ((((in_ESI % 2 == 1) && (in_EDX % 2 == 1)) && (0 < in_ESI)) && (0 < in_EDX)) {
    uVar1 = 0;
    std::allocator<float>::allocator((allocator<float> *)0x11c6cf);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               (size_type)in_RDI,(value_type_conflict2 *)this_01,in_stack_ffffffffffffffa8);
    std::vector<float,_std::allocator<float>_>::operator=
              (this_01,(vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffffa8);
    std::vector<float,_std::allocator<float>_>::~vector(this_01);
    std::allocator<float>::~allocator((allocator<float> *)0x11c710);
    in_RDI[3] = in_EDX / 2;
    in_RDI[2] = in_ESI / 2;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Each kernel dimension must be positive uneven.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Kernel::Kernel(int width, int height) : width(width), height(height) {
  if ((width % 2 != 1) || (height % 2 != 1) || (width < 1) || (height < 1)) {
    throw std::runtime_error("Each kernel dimension must be positive uneven.");
  }
  weights = std::vector<float>((size_t) (width * height), 0.0f);
  yoff = height / 2;
  xoff = width / 2;
}